

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::UpdateMouseMovingWindowEndFrame(void)

{
  ImGuiContext *pIVar1;
  bool bVar2;
  ImGuiWindow *pIVar3;
  ImGuiWindow **ppIVar4;
  ImGuiWindow *window;
  int i;
  bool hovered_window_above_modal;
  ImGuiWindow *modal;
  ImGuiContext *g;
  int in_stack_ffffffffffffffbc;
  ImVector<ImGuiWindow_*> *in_stack_ffffffffffffffc0;
  ImGuiWindow *in_stack_ffffffffffffffd0;
  int local_28;
  ImGuiWindow *in_stack_ffffffffffffffe0;
  ImRect in_stack_ffffffffffffffe8;
  unkbyte9 Var5;
  
  pIVar1 = GImGui;
  if (((GImGui->ActiveId == 0) && (GImGui->HoveredId == 0)) &&
     ((GImGui->NavWindow == (ImGuiWindow *)0x0 || ((GImGui->NavWindow->Appearing & 1U) == 0)))) {
    if (((GImGui->IO).MouseClicked[0] & 1U) != 0) {
      if (GImGui->HoveredRootWindow == (ImGuiWindow *)0x0) {
        if ((GImGui->NavWindow != (ImGuiWindow *)0x0) &&
           (pIVar3 = GetTopMostPopupModal(), pIVar3 == (ImGuiWindow *)0x0)) {
          FocusWindow(in_stack_ffffffffffffffe0);
        }
      }
      else {
        StartMouseMovingWindow(in_stack_ffffffffffffffd0);
        if ((((pIVar1->IO).ConfigWindowsMoveFromTitleBarOnly & 1U) != 0) &&
           ((pIVar1->HoveredRootWindow->Flags & 1U) == 0)) {
          in_stack_ffffffffffffffe8 = ImGuiWindow::TitleBarRect(in_stack_ffffffffffffffd0);
          bVar2 = ImRect::Contains((ImRect *)&stack0xffffffffffffffe8,(pIVar1->IO).MouseClickedPos);
          if (((bVar2 ^ 0xffU) & 1) != 0) {
            pIVar1->MovingWindow = (ImGuiWindow *)0x0;
          }
        }
      }
    }
    if (((pIVar1->IO).MouseClicked[1] & 1U) != 0) {
      pIVar3 = GetTopMostPopupModal();
      bVar2 = pIVar3 == (ImGuiWindow *)0x0;
      local_28 = (pIVar1->Windows).Size;
      while (Var5 = in_stack_ffffffffffffffe8._7_9_, local_28 = local_28 + -1,
            -1 < local_28 && !bVar2) {
        ppIVar4 = ImVector<ImGuiWindow_*>::operator[]
                            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
        Var5 = in_stack_ffffffffffffffe8._7_9_;
        if (*ppIVar4 == pIVar3) break;
        if (*ppIVar4 == pIVar1->HoveredWindow) {
          bVar2 = true;
        }
      }
      ClosePopupsOverWindow((ImGuiWindow *)SUB98(Var5,1),SUB91(Var5,0));
    }
  }
  return;
}

Assistant:

void ImGui::UpdateMouseMovingWindowEndFrame()
{
    ImGuiContext& g = *GImGui;
    if (g.ActiveId != 0 || g.HoveredId != 0)
        return;

    // Unless we just made a window/popup appear
    if (g.NavWindow && g.NavWindow->Appearing)
        return;

    // Click to focus window and start moving (after we're done with all our widgets)
    if (g.IO.MouseClicked[0])
    {
        if (g.HoveredRootWindow != NULL)
        {
            StartMouseMovingWindow(g.HoveredWindow);
            if (g.IO.ConfigWindowsMoveFromTitleBarOnly && !(g.HoveredRootWindow->Flags & ImGuiWindowFlags_NoTitleBar))
                if (!g.HoveredRootWindow->TitleBarRect().Contains(g.IO.MouseClickedPos[0]))
                    g.MovingWindow = NULL;
        }
        else if (g.NavWindow != NULL && GetTopMostPopupModal() == NULL)
        {
            // Clicking on void disable focus
            FocusWindow(NULL);
        }
    }

    // With right mouse button we close popups without changing focus based on where the mouse is aimed
    // Instead, focus will be restored to the window under the bottom-most closed popup.
    // (The left mouse button path calls FocusWindow on the hovered window, which will lead NewFrame->ClosePopupsOverWindow to trigger)
    if (g.IO.MouseClicked[1])
    {
        // Find the top-most window between HoveredWindow and the top-most Modal Window.
        // This is where we can trim the popup stack.
        ImGuiWindow* modal = GetTopMostPopupModal();
        bool hovered_window_above_modal = false;
        if (modal == NULL)
            hovered_window_above_modal = true;
        for (int i = g.Windows.Size - 1; i >= 0 && hovered_window_above_modal == false; i--)
        {
            ImGuiWindow* window = g.Windows[i];
            if (window == modal)
                break;
            if (window == g.HoveredWindow)
                hovered_window_above_modal = true;
        }
        ClosePopupsOverWindow(hovered_window_above_modal ? g.HoveredWindow : modal, true);
    }
}